

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O1

void __thiscall
cmDebugger_impl::PreRunHook
          (cmDebugger_impl *this,cmListFileContext *context,cmListFileFunction *line)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer pcVar4;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  cmListFileBacktrace local_50;
  
  SetState(this,Running);
  std::__cxx11::string::_M_assign((string *)&this->currentLocation);
  std::__cxx11::string::_M_assign((string *)&(this->currentLocation).FilePath);
  (this->currentLocation).Line = context->Line;
  if (this->breakDepth != -1) {
    (**(this->super_cmDebugger)._vptr_cmDebugger)(&local_50,this);
    sVar3 = cmListFileBacktrace::Depth(&local_50);
    cmListFileBacktrace::~cmListFileBacktrace(&local_50);
    if (sVar3 == (long)this->breakDepth) {
      LOCK();
      (this->breakPending)._M_base._M_i = true;
      UNLOCK();
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pcVar4 = (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar4) {
    uVar6 = 0;
    do {
      bVar1 = cmBreakpoint::matches(pcVar4 + uVar6,&context->FilePath,context->Line);
      if (bVar1) {
        LOCK();
        (this->breakPending)._M_base._M_i = true;
        UNLOCK();
        for (p_Var5 = (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &(this->listeners)._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          (**(code **)(**(long **)(p_Var5 + 1) + 0x18))(*(long **)(p_Var5 + 1),uVar6);
        }
        if (bVar1) break;
      }
      uVar6 = uVar6 + 1;
      pcVar4 = (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)(((long)(this->breakpoints).
                                    super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pcVar4 >> 4) *
                            -0x5555555555555555));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  if (((this->breakPending)._M_base._M_i & 1U) != 0) {
    PauseExecution(this);
  }
  return;
}

Assistant:

void PreRunHook(const cmListFileContext& context,
                  const cmListFileFunction& line) override
  {
    (void)line;

    SetState(State::Running);
    currentLocation = context;

    // Step in / Step out logic. We have a target
    // stack depth, and when we hit it, pause.
    if (breakDepth != -1) {
      auto currentDepth = GetBacktrace().Depth();
      if (currentDepth == (size_t)breakDepth) {
        breakPending = true;
      }
    }

    // Breakpoint detection
    {
      std::lock_guard<std::mutex> lock(breakpointMutex);
      for (size_t bid = 0; bid < breakpoints.size(); bid++) {
        auto& bp = breakpoints[bid];
        if (bp.matches(context)) {
          breakPending = true;
          for (auto& l : listeners) {
            l->OnBreakpoint(bid);
          }
          break;
        }
      }
    }

    // If a break is pending, act on it.
    // Note that we
    if (breakPending) {
      PauseExecution();
    }
  }